

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xml_attribute __thiscall pugi::xml_node::append_attribute(xml_node *this,char_t *name_)

{
  xml_node_struct *node;
  xml_attribute_struct *header;
  uint uVar1;
  
  node = this->_root;
  if (node != (xml_node_struct *)0x0) {
    uVar1 = (uint)node->header & 7;
    if (((uVar1 == 6) || (uVar1 == 1)) &&
       (header = impl::anon_unknown_0::append_attribute_ll
                           (node,*(xml_allocator **)(node->header & 0xffffffffffffffe0)),
       header != (xml_attribute_struct *)0x0)) {
      impl::anon_unknown_0::strcpy_insitu(&header->name,&header->header,0x10,name_);
      return (xml_attribute)header;
    }
  }
  return (xml_attribute)(xml_attribute_struct *)0x0;
}

Assistant:

PUGI__FN xml_node_type xml_node::type() const
	{
		return _root ? static_cast<xml_node_type>((_root->header & impl::xml_memory_page_type_mask) + 1) : node_null;
	}